

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::CreateCustomTargetsAndCommands
          (cmLocalGenerator *this,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *lang)

{
  cmGeneratorTarget *this_00;
  cmTarget *this_01;
  size_type sVar1;
  uint uVar2;
  size_type sVar3;
  _Base_ptr p_Var4;
  _Self __tmp;
  string llang;
  cmGeneratorTargetsType tgts;
  allocator local_b1;
  cmLocalGenerator *local_b0;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_a8;
  string local_a0;
  _Rb_tree<const_cmTarget_*,_std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>,_std::_Select1st<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>,_cmStrictTargetComparison,_std::allocator<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>_>
  local_80;
  string local_50;
  
  local_b0 = this;
  local_a8 = lang;
  std::
  _Rb_tree<const_cmTarget_*,_std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>,_std::_Select1st<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>,_cmStrictTargetComparison,_std::allocator<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>_>
  ::_Rb_tree(&local_80,&(this->Makefile->GeneratorTargets)._M_t);
  for (p_Var4 = local_80._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &local_80._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    if (*(char *)(*(long *)(p_Var4 + 1) + 0x2e9) == '\0') {
      this_00 = (cmGeneratorTarget *)p_Var4[1]._M_parent;
      uVar2 = cmGeneratorTarget::GetType(this_00);
      if (uVar2 < 4) {
        this_01 = this_00->Target;
        std::__cxx11::string::string((string *)&local_50,"",&local_b1);
        cmTarget::GetLinkerLanguage(&local_a0,this_01,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        sVar1 = local_a0._M_string_length;
        if (local_a0._M_string_length == 0) {
          cmSystemTools::Error
                    ("CMake can not determine linker language for target: ",
                     (this_00->Target->Name)._M_dataplus._M_p,(char *)0x0,(char *)0x0);
        }
        else {
          sVar3 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count(local_a8,&local_a0);
          if (sVar3 == 0) {
            AddBuildTargetRule(local_b0,&local_a0,this_00);
          }
        }
        std::__cxx11::string::~string((string *)&local_a0);
        if (sVar1 == 0) break;
      }
    }
  }
  std::
  _Rb_tree<const_cmTarget_*,_std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>,_std::_Select1st<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>,_cmStrictTargetComparison,_std::allocator<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>_>
  ::~_Rb_tree(&local_80);
  return;
}

Assistant:

void cmLocalGenerator
::CreateCustomTargetsAndCommands(std::set<std::string> const& lang)
{
  cmGeneratorTargetsType tgts = this->Makefile->GetGeneratorTargets();
  for(cmGeneratorTargetsType::iterator l = tgts.begin();
      l != tgts.end(); l++)
    {
    if (l->first->IsImported())
      {
      continue;
      }
    cmGeneratorTarget& target = *l->second;
    switch(target.GetType())
      {
      case cmTarget::STATIC_LIBRARY:
      case cmTarget::SHARED_LIBRARY:
      case cmTarget::MODULE_LIBRARY:
      case cmTarget::EXECUTABLE:
        {
        std::string llang = target.Target->GetLinkerLanguage();
        if(llang.empty())
          {
          cmSystemTools::Error
            ("CMake can not determine linker language for target: ",
             target.Target->GetName().c_str());
          return;
          }
        // if the language is not in the set lang then create custom
        // commands to build the target
        if(lang.count(llang) == 0)
          {
          this->AddBuildTargetRule(llang, target);
          }
        }
        break;
      default:
        break;
      }
    }
}